

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::QuerySolarisProcessor(SystemInformationImplementation *this)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  SystemInformationImplementation *local_18;
  SystemInformationImplementation *this_local;
  
  local_18 = this;
  bVar1 = QueryProcessorBySysconf(this);
  if (bVar1) {
    ParseValueFromKStat_abi_cxx11_(&local_38,this,"-s clock_MHz");
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    this->CPUSpeedInMHz = (float)iVar2;
    std::__cxx11::string::~string((string *)&local_38);
    (this->ChipID).Family = 0;
    ParseValueFromKStat_abi_cxx11_(&local_58,this,"-s cpu_type");
    std::__cxx11::string::operator=((string *)&(this->ChipID).ProcessorName,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    (this->ChipID).Model = 0;
    bVar1 = std::operator!=(&(this->ChipID).ProcessorName,"i386");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,"Sun");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
      FindManufacturer(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SystemInformationImplementation::QuerySolarisProcessor()
{
  if (!this->QueryProcessorBySysconf()) {
    return false;
  }

  // Parse values
  this->CPUSpeedInMHz = static_cast<float>(
    atoi(this->ParseValueFromKStat("-s clock_MHz").c_str()));

  // Chip family
  this->ChipID.Family = 0;

  // Chip Model
  this->ChipID.ProcessorName = this->ParseValueFromKStat("-s cpu_type");
  this->ChipID.Model = 0;

  // Chip Vendor
  if (this->ChipID.ProcessorName != "i386") {
    this->ChipID.Vendor = "Sun";
    this->FindManufacturer();
  }

  return true;
}